

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiPassResourceTracker::registerTexture
          (QRhiPassResourceTracker *this,QRhiTexture *tex,TextureAccess *access,TextureStage *stage,
          UsageState *state)

{
  TextureAccess TVar1;
  TextureStage TVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *pDVar6;
  ulong uVar7;
  TextureStage TVar8;
  uint uVar9;
  long in_FS_OFFSET;
  iterator iVar10;
  QRhiTexture *copy;
  Texture local_68;
  QRhiPassResourceTracker local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_buffers.d = (Data *)tex;
  iVar10 = QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::findImpl<QRhiTexture*>
                     ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,
                      (QRhiTexture **)&local_48);
  pDVar6 = iVar10.i.d;
  if (pDVar6 == (Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *)0x0 &&
      iVar10.i.bucket == 0) {
    local_68.stage = *stage;
    local_68.access = *access;
    local_68.stateAtPassBegin.layout = state->layout;
    local_68.stateAtPassBegin.access = state->access;
    local_68.stateAtPassBegin.stage = state->stage;
    local_48.m_textures.d = (Data *)local_48.m_buffers.d;
    QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::
    emplace<QRhiPassResourceTracker::Texture_const&>
              ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,
               (QRhiTexture **)&local_48.m_textures,&local_68);
  }
  else {
    pSVar3 = pDVar6->spans;
    uVar7 = iVar10.i.bucket >> 7;
    uVar9 = (uint)iVar10.i.bucket & 0x7f;
    pEVar4 = pSVar3[uVar7].entries;
    TVar1 = *(TextureAccess *)(pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data + 8);
    if (TVar1 != *access) {
      if ((TVar1 - TexStorageLoad < 3) && (*access - TexStorageLoad < 3)) {
        pEVar5 = pEVar4 + pSVar3[uVar7].offsets[uVar9];
        (pEVar5->storage).data[8] = '\x05';
        (pEVar5->storage).data[9] = '\0';
        (pEVar5->storage).data[10] = '\0';
        (pEVar5->storage).data[0xb] = '\0';
        *access = *(TextureAccess *)(pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data + 8);
      }
      else {
        registerTexture(&local_48);
      }
    }
    pSVar3 = pDVar6->spans;
    pEVar4 = pSVar3[uVar7].entries;
    TVar2 = *(TextureStage *)(pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data + 0xc);
    TVar8 = *stage;
    if (TVar2 != TVar8) {
      if ((int)TVar2 < (int)TVar8) {
        TVar8 = TVar2;
      }
      *(TextureStage *)(pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data + 0xc) = TVar8;
      *stage = *(TextureStage *)(pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data + 0xc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiPassResourceTracker::registerTexture(QRhiTexture *tex, TextureAccess *access, TextureStage *stage,
                                              const UsageState &state)
{
    auto it = m_textures.find(tex);
    if (it != m_textures.end()) {
        if (it->access != *access) {
            // Different subresources of a texture may be used for both load
            // and store in the same pass. (think reading from one mip level
            // and writing to another one in a compute shader) This we can
            // handle by treating the entire resource as read-write.
            if (isImageLoadStore(it->access) && isImageLoadStore(*access)) {
                it->access = QRhiPassResourceTracker::TexStorageLoadStore;
                *access = it->access;
            } else {
                const QByteArray name = tex->name();
                qWarning("Texture %p (%s) used with different accesses within the same pass, this is not allowed.",
                         tex, name.constData());
            }
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Texture t;
    t.access = *access;
    t.stage = *stage;
    t.stateAtPassBegin = state; // first use -> initial state
    m_textures.insert(tex, t);
}